

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O3

void push_object(loc grid)

{
  object *poVar1;
  _Bool _Var2;
  wchar_t wVar3;
  object *poVar4;
  object *dest;
  loc lVar5;
  object *poVar6;
  size_t sVar7;
  monster *pmVar8;
  queue *q;
  wchar_t d;
  object *obj;
  loc newgrid;
  _Bool local_59;
  object *local_58;
  queue *local_50;
  loc local_48;
  trap *local_40;
  feature *local_38;
  
  local_38 = square_feat(cave,grid);
  poVar4 = square_object(cave,grid);
  local_58 = poVar4;
  local_50 = q_new((ulong)z_info->floor_size);
  local_40 = square_trap(cave,grid);
  while (poVar4 != (object *)0x0) {
    poVar1 = poVar4->next;
    dest = (object *)mem_alloc(0x148);
    memcpy(dest,&OBJECT_NULL,0x148);
    object_copy(dest,poVar4);
    dest->oidx = 0;
    lVar5 = (loc)loc(0,0);
    dest->grid = lVar5;
    if (dest->known != (object *)0x0) {
      poVar6 = (object *)mem_alloc(0x148);
      memcpy(poVar6,&OBJECT_NULL,0x148);
      dest->known = poVar6;
      object_copy(poVar6,poVar4->known);
      poVar6 = dest->known;
      poVar6->oidx = 0;
      lVar5 = (loc)loc(0,0);
      poVar6->grid = lVar5;
    }
    q_push(local_50,(uintptr_t)dest);
    delist_object(cave,poVar4);
    object_delete((chunk *)cave,(chunk *)player->cave,&local_58);
    poVar4 = poVar1;
    local_58 = poVar1;
  }
  square_set_obj(cave,grid,(object *)0x0);
  square_force_floor(cave,grid);
  square_add_door(cave,grid,false);
  q = local_50;
  sVar7 = q_len(local_50);
  if (sVar7 != 0) {
    do {
      poVar4 = (object *)q_pop(q);
      local_58 = poVar4;
      if (poVar4->mimicking_m_idx == 0) {
        drop_near((chunk *)cave,&local_58,L'\0',grid,false,false);
      }
      else {
        pmVar8 = cave_monster(cave,(int)poVar4->mimicking_m_idx);
        if (pmVar8 == (monster *)0x0) {
          __assert_fail("mimic",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                        ,0x4c2,"void push_object(struct loc)");
        }
        pmVar8->mimicked_obj = (object *)0x0;
        d = L'\x01';
        do {
          wVar3 = scatter_ext(cave,&local_48,L'\x01',grid,d,true,square_isempty);
          if ((L'\0' < wVar3) &&
             (_Var2 = floor_carry((chunk *)cave,local_48,poVar4,&local_59), _Var2)) {
            monster_swap(grid,local_48);
            pmVar8->mimicked_obj = poVar4;
            q = local_50;
            goto LAB_001ab600;
          }
          d = d + L'\x01';
        } while (d != L'\x04');
        delete_monster_idx((chunk *)cave,(int)poVar4->mimicking_m_idx);
        if (poVar4->known != (object *)0x0) {
          object_delete((chunk *)player->cave,(chunk *)0x0,&poVar4->known);
        }
        object_delete((chunk *)cave,(chunk *)player->cave,&local_58);
        q = local_50;
      }
LAB_001ab600:
      sVar7 = q_len(q);
    } while (sVar7 != 0);
  }
  square_set_feat(cave,grid,local_38->fidx);
  if ((local_40 != (trap *)0x0) && (_Var2 = square_istrappable(cave,grid), !_Var2)) {
    square_destroy_trap(cave,grid);
  }
  q_free(q);
  return;
}

Assistant:

void push_object(struct loc grid)
{
	/* Save the original terrain feature */
	struct feature *feat_old = square_feat(cave, grid);
	struct object *obj = square_object(cave, grid);
	struct queue *queue = q_new(z_info->floor_size);
	struct trap *trap = square_trap(cave, grid);

	/* Push all objects on the square, stripped of pile info, into the queue */
	while (obj) {
		struct object *next = obj->next;
		/* In case the object is known, make a copy to work with
		 * and try to delete the original which will orphan it to
		 * serve as a placeholder for the known version. */
		struct object *newobj = object_new();

		object_copy(newobj, obj);
		newobj->oidx = 0;
		newobj->grid = loc(0, 0);
		if (newobj->known) {
			newobj->known = object_new();
			object_copy(newobj->known, obj->known);
			newobj->known->oidx = 0;
			newobj->known->grid = loc(0, 0);
		}
		q_push_ptr(queue, newobj);

		delist_object(cave, obj);
		object_delete(cave, player->cave, &obj);

		/* Next object */
		obj = next;
	}

	/* Disassociate the objects from the square */
	square_set_obj(cave, grid, NULL);

	/* Set feature to an open door */
	square_force_floor(cave, grid);
	square_add_door(cave, grid, false);

	/* Drop objects back onto the floor */
	while (q_len(queue) > 0) {
		/* Take object from the queue */
		obj = q_pop_ptr(queue);

		/* Unrevealed mimics require special handling, as always. */
		if (obj->mimicking_m_idx) {
			struct monster *mimic =
				cave_monster(cave, obj->mimicking_m_idx);
			int d;

			assert(mimic);
			/*
			 * Reset since the current value is a dangling
			 * reference to a deleted object.
			 */
			mimic->mimicked_obj = NULL;

			/* Try to find a location; use closer grids first. */
			d = 1;
			while (1) {
				struct loc newgrid;
				bool dummy = true;

				if (d >= 4) {
					/*
					 * Give up.  Destroy both the mimic
					 * and the object.
					 */
					delete_monster_idx(cave, obj->mimicking_m_idx);
					if (obj->known) {
						object_delete(player->cave, NULL, &obj->known);
					}
					object_delete(cave, player->cave, &obj);
					break;
				}
				if (scatter_ext(cave, &newgrid, 1, grid, d,
						true, square_isempty) > 0
						&& floor_carry(cave, newgrid,
						obj, &dummy)) {
					/*
					 * Move the monster and give it the
					 * object.
					 */
					monster_swap(grid, newgrid);
					mimic->mimicked_obj = obj;
					break;
				}
				++d;
			}
		} else {
			/* Drop the object */
			drop_near(cave, &obj, 0, grid, false, false);
		}
	}

	/* Reset cave feature, remove trap if needed */
	square_set_feat(cave, grid, feat_old->fidx);
	if (trap && !square_istrappable(cave, grid)) {
		square_destroy_trap(cave, grid);
	}

	q_free(queue);
}